

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O2

bool __thiscall llvm::SmallPtrSetImplBase::erase_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  void **ppvVar1;
  void **ppvVar2;
  
  ppvVar2 = find_imp(this,Ptr);
  ppvVar1 = this->CurArray + (&this->CurArraySize)[this->CurArray == this->SmallArray];
  if (ppvVar2 != ppvVar1) {
    if (*ppvVar2 != Ptr) {
      __assert_fail("*Loc == Ptr && \"broken find!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                    ,0xa8,"bool llvm::SmallPtrSetImplBase::erase_imp(const void *)");
    }
    *ppvVar2 = (void *)0xfffffffffffffffe;
    this->NumTombstones = this->NumTombstones + 1;
  }
  return ppvVar2 != ppvVar1;
}

Assistant:

bool erase_imp(const void * Ptr) {
    const void *const *P = find_imp(Ptr);
    if (P == EndPointer())
      return false;

    const void **Loc = const_cast<const void **>(P);
    assert(*Loc == Ptr && "broken find!");
    *Loc = getTombstoneMarker();
    NumTombstones++;
    return true;
  }